

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O3

ll_elem * ll_pop_back(ll_head *q_head,int wait)

{
  atomic_size_t *paVar1;
  atomic_size_t aVar2;
  ll_elem *plVar3;
  ll_head *n;
  
  while( true ) {
    plVar3 = pred(q_head,&q_head->q);
    n = (ll_head *)((ulong)plVar3 & 0xfffffffffffffffc);
    if (n == q_head) break;
    do {
      plVar3 = ll_unlink(q_head,&n->q,wait);
      if (plVar3 != (ll_elem *)0x0) {
        return &n->q;
      }
      plVar3 = pred(q_head,&n->q);
      LOCK();
      paVar1 = &(n->q).refcnt;
      aVar2 = *paVar1;
      *paVar1 = *paVar1 - 1;
      UNLOCK();
      if (aVar2 == 0) goto LAB_00102c36;
      n = (ll_head *)((ulong)plVar3 & 0xfffffffffffffffc);
    } while (n != q_head);
    LOCK();
    paVar1 = &(n->q).refcnt;
    aVar2 = *paVar1;
    *paVar1 = *paVar1 - 1;
    UNLOCK();
    if (aVar2 == 0) goto LAB_00102c36;
  }
  LOCK();
  paVar1 = &(n->q).refcnt;
  aVar2 = *paVar1;
  *paVar1 = *paVar1 - 1;
  UNLOCK();
  if (aVar2 != 0) {
    return (ll_elem *)0x0;
  }
LAB_00102c36:
  __assert_fail("old >= count",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x9a,
                "void deref_release(struct ll_head *, struct ll_elem *, size_t)");
}

Assistant:

struct ll_elem*
ll_pop_back(struct ll_head *q_head, int wait)
{
	struct ll_elem	*q, *n, *n_;

	q = &q_head->q;
	while ((n = ptr_clear(pred(q_head, q))) != q) {
		do {
			if (ll_unlink(q_head, n, wait))
				return n;
			n_ = n;
			n = ptr_clear(pred(q_head, n_));
			deref_release(q_head, n_, 1);
		} while (n != q);
		deref_release(q_head, n, 1);
	}
	deref_release(q_head, n, 1);
	return NULL;
}